

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

void Cmd_menu_endgame(FCommandLine *argv,APlayerPawn *who,int key)

{
  DMenu *menu;
  FSoundID *this;
  float fVar1;
  DMenu *newmenu;
  FSoundID local_20;
  int local_1c;
  APlayerPawn *pAStack_18;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  local_1c = key;
  pAStack_18 = who;
  who_local = (APlayerPawn *)argv;
  if (usergame) {
    this = (FSoundID *)((long)&newmenu + 4);
    FSoundID::FSoundID(this,"menu/activate");
    fVar1 = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
    S_Sound(0x22,this,fVar1,0.0);
    menu = (DMenu *)DObject::operator_new((DObject *)0x50,(size_t)this);
    DEndGameMenu::DEndGameMenu((DEndGameMenu *)menu,false);
    TObjPtr<DMenu>::operator=(&menu->mParentMenu,DMenu::CurrentMenu);
    M_ActivateMenu(menu);
  }
  else {
    FSoundID::FSoundID(&local_20,"menu/invalid");
    fVar1 = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
    S_Sound(0x22,&local_20,fVar1,0.0);
  }
  return;
}

Assistant:

CCMD (menu_endgame)
{	// F7
	if (!usergame)
	{
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/invalid", snd_menuvolume, ATTN_NONE);
		return;
	}
		
	//M_StartControlPanel (true);
	S_Sound (CHAN_VOICE | CHAN_UI, "menu/activate", snd_menuvolume, ATTN_NONE);
	DMenu *newmenu = new DEndGameMenu(false);
	newmenu->mParentMenu = DMenu::CurrentMenu;
	M_ActivateMenu(newmenu);
}